

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_hdr_from_file(FILE *f)

{
  int *data;
  int iVar1;
  undefined1 local_e0 [8];
  stbi__context s;
  
  data = &s.read_from_callbacks;
  s.io.skip = stbi__stdio_eof;
  s.img_n = 0x114ef7;
  s.img_out_n = 0;
  s.io.read._0_4_ = 0x114f12;
  s.io.read._4_4_ = 0;
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)f;
  s.img_buffer_end = (stbi_uc *)data;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar1 + (long)data);
  }
  s.buffer_start._120_8_ = data;
  iVar1 = stbi__hdr_test((stbi__context *)local_e0);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__hdr_test(&s);
   #else
   return 0;
   #endif
}